

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacencyTests.cpp
# Opt level: O3

void __thiscall
glcts::GeometryShaderAdjacencyTests::setLinePointsindiced
          (GeometryShaderAdjacencyTests *this,AdjacencyTestData *test_data)

{
  uint uVar1;
  uint uVar2;
  AdjacencyGrid *pAVar3;
  AdjacencyGridLineSegment *pAVar4;
  undefined4 *puVar5;
  undefined4 *puVar6;
  undefined4 *puVar7;
  undefined4 *puVar8;
  uint uVar9;
  GLfloat *pGVar10;
  GLfloat *pGVar11;
  GLuint *pGVar12;
  GLfloat *pGVar13;
  GLfloat *pGVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  
  pAVar3 = test_data->m_grid;
  uVar1 = pAVar3->m_n_segments;
  test_data->m_n_vertices = uVar1 * 2;
  uVar17 = this->m_n_components_output * uVar1 * 8;
  test_data->m_geometry_bo_size = uVar17;
  uVar2 = pAVar3->m_n_points;
  uVar9 = this->m_n_components_input * uVar2 * 4;
  test_data->m_vertex_data_bo_size = uVar9;
  test_data->m_index_data_bo_size = uVar1 << 4;
  pGVar10 = (GLfloat *)operator_new__((ulong)uVar17);
  test_data->m_expected_adjacency_geometry = pGVar10;
  pGVar11 = (GLfloat *)operator_new__((ulong)uVar17);
  test_data->m_expected_geometry = pGVar11;
  pGVar12 = (GLuint *)operator_new__((ulong)(uVar1 << 4));
  test_data->m_index_data = pGVar12;
  pGVar13 = (GLfloat *)operator_new__((ulong)uVar9);
  test_data->m_vertex_data = pGVar13;
  if ((ulong)uVar2 != 0) {
    pGVar14 = &pAVar3->m_points->y;
    uVar16 = 0;
    do {
      pGVar13[uVar16 * 2] = pGVar14[-1];
      pGVar13[uVar16 * 2 + 1] = *pGVar14;
      uVar16 = uVar16 + 1;
      pGVar14 = pGVar14 + 3;
    } while (uVar2 != uVar16);
  }
  if ((ulong)uVar1 != 0) {
    pAVar4 = pAVar3->m_line_segments;
    lVar15 = 0;
    uVar16 = 0;
    do {
      puVar5 = *(undefined4 **)((long)&pAVar4->m_point_end_adjacent + lVar15 * 2);
      *(undefined4 *)((long)pGVar12 + lVar15) = *puVar5;
      puVar6 = *(undefined4 **)((long)&pAVar4->m_point_end + lVar15 * 2);
      *(undefined4 *)((long)pGVar12 + lVar15 + 4) = *puVar6;
      puVar7 = *(undefined4 **)((long)&pAVar4->m_point_start + lVar15 * 2);
      *(undefined4 *)((long)pGVar12 + lVar15 + 8) = *puVar7;
      puVar8 = *(undefined4 **)((long)&pAVar4->m_point_start_adjacent + lVar15 * 2);
      *(undefined4 *)((long)pGVar12 + lVar15 + 0xc) = *puVar8;
      *(undefined4 *)((long)pGVar10 + lVar15 * 2) = puVar5[1];
      *(undefined4 *)((long)pGVar10 + lVar15 * 2 + 4) = puVar5[2];
      *(undefined8 *)((long)pGVar10 + lVar15 * 2 + 8) = 0x3f80000000000000;
      *(undefined4 *)((long)pGVar10 + lVar15 * 2 + 0x10) = puVar8[1];
      *(undefined4 *)((long)pGVar10 + lVar15 * 2 + 0x14) = puVar8[2];
      *(undefined8 *)((long)pGVar10 + lVar15 * 2 + 0x18) = 0x3f80000000000000;
      *(undefined4 *)((long)pGVar11 + lVar15 * 2) = puVar6[1];
      *(undefined4 *)((long)pGVar11 + lVar15 * 2 + 4) = puVar6[2];
      *(undefined8 *)((long)pGVar11 + lVar15 * 2 + 8) = 0x3f80000000000000;
      *(undefined4 *)((long)pGVar11 + lVar15 * 2 + 0x10) = puVar7[1];
      *(undefined4 *)((long)pGVar11 + lVar15 * 2 + 0x14) = puVar7[2];
      *(undefined8 *)((long)pGVar11 + lVar15 * 2 + 0x18) = 0x3f80000000000000;
      uVar16 = uVar16 + 1;
      lVar15 = lVar15 + 0x10;
    } while (uVar16 < uVar1);
  }
  return;
}

Assistant:

void GeometryShaderAdjacencyTests::setLinePointsindiced(AdjacencyTestData& test_data)
{
	float*		  travellerExpectedAdjacencyGeometryPtr = 0;
	float*		  travellerExpectedGeometryPtr			= 0;
	unsigned int* travellerIndicesPtr					= 0;
	float*		  travellerPtr							= 0;

	/* Set buffer sizes */
	test_data.m_n_vertices = test_data.m_grid->m_n_segments * 2 /* start + end points form a segment */;
	test_data.m_geometry_bo_size =
		static_cast<glw::GLuint>(test_data.m_n_vertices * m_n_components_output * sizeof(float));
	test_data.m_vertex_data_bo_size =
		static_cast<glw::GLuint>(test_data.m_grid->m_n_points * m_n_components_input * sizeof(float));
	test_data.m_index_data_bo_size =
		static_cast<glw::GLuint>(test_data.m_n_vertices * 2 /* include adjacency info */ * sizeof(unsigned int));

	/* Allocate memory for input and expected data */
	test_data.m_expected_adjacency_geometry = new float[test_data.m_geometry_bo_size / sizeof(float)];
	test_data.m_expected_geometry			= new float[test_data.m_geometry_bo_size / sizeof(float)];
	test_data.m_index_data					= new unsigned int[test_data.m_index_data_bo_size / sizeof(unsigned int)];
	test_data.m_vertex_data					= new float[test_data.m_vertex_data_bo_size / sizeof(float)];

	travellerExpectedAdjacencyGeometryPtr = test_data.m_expected_adjacency_geometry;
	travellerExpectedGeometryPtr		  = test_data.m_expected_geometry;
	travellerIndicesPtr					  = test_data.m_index_data;
	travellerPtr						  = test_data.m_vertex_data;

	/* Set input and expected values */
	for (unsigned int n = 0; n < test_data.m_grid->m_n_points; ++n)
	{
		*travellerPtr = test_data.m_grid->m_points[n].x;
		++travellerPtr;
		*travellerPtr = test_data.m_grid->m_points[n].y;
		++travellerPtr;
	}

	for (unsigned int n = 0; n < test_data.m_grid->m_n_segments; ++n)
	{
		AdjacencyGridLineSegment* segmentPtr = test_data.m_grid->m_line_segments + n;

		*travellerIndicesPtr = segmentPtr->m_point_end_adjacent->index;
		++travellerIndicesPtr;
		*travellerIndicesPtr = segmentPtr->m_point_end->index;
		++travellerIndicesPtr;
		*travellerIndicesPtr = segmentPtr->m_point_start->index;
		++travellerIndicesPtr;
		*travellerIndicesPtr = segmentPtr->m_point_start_adjacent->index;
		++travellerIndicesPtr;

		*travellerExpectedAdjacencyGeometryPtr = segmentPtr->m_point_end_adjacent->x;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = segmentPtr->m_point_end_adjacent->y;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 0;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 1;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = segmentPtr->m_point_start_adjacent->x;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = segmentPtr->m_point_start_adjacent->y;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 0;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 1;
		++travellerExpectedAdjacencyGeometryPtr;

		*travellerExpectedGeometryPtr = segmentPtr->m_point_end->x;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = segmentPtr->m_point_end->y;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 0;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 1;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = segmentPtr->m_point_start->x;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = segmentPtr->m_point_start->y;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 0;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 1;
		++travellerExpectedGeometryPtr;
	} /* for (all line segments) */
}